

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_avx2.c
# Opt level: O0

uint masked_sad32xh_avx2(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
                        int b_stride,uint8_t *m_ptr,int m_stride,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long in_stack_00000008;
  int32_t sad;
  __m256i pred_r;
  __m256i mask_r;
  __m256i data_r;
  __m256i pred_l;
  __m256i mask_l;
  __m256i data_l;
  __m256i m_inv;
  __m256i m;
  __m256i b;
  __m256i a;
  __m256i src;
  __m256i round_scale;
  __m256i mask_max;
  __m256i res;
  int y;
  int x;
  undefined1 local_500 [32];
  undefined4 local_4d4;
  undefined4 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  local_500 = ZEXT1632(ZEXT816(0));
  auVar5 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar5 = vpinsrb_avx(auVar5,0x40,2);
  auVar5 = vpinsrb_avx(auVar5,0x40,3);
  auVar5 = vpinsrb_avx(auVar5,0x40,4);
  auVar5 = vpinsrb_avx(auVar5,0x40,5);
  auVar5 = vpinsrb_avx(auVar5,0x40,6);
  auVar5 = vpinsrb_avx(auVar5,0x40,7);
  auVar5 = vpinsrb_avx(auVar5,0x40,8);
  auVar5 = vpinsrb_avx(auVar5,0x40,9);
  auVar5 = vpinsrb_avx(auVar5,0x40,10);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xb);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xc);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xd);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xe);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xf);
  auVar10 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar10 = vpinsrb_avx(auVar10,0x40,2);
  auVar10 = vpinsrb_avx(auVar10,0x40,3);
  auVar10 = vpinsrb_avx(auVar10,0x40,4);
  auVar10 = vpinsrb_avx(auVar10,0x40,5);
  auVar10 = vpinsrb_avx(auVar10,0x40,6);
  auVar10 = vpinsrb_avx(auVar10,0x40,7);
  auVar10 = vpinsrb_avx(auVar10,0x40,8);
  auVar10 = vpinsrb_avx(auVar10,0x40,9);
  auVar10 = vpinsrb_avx(auVar10,0x40,10);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xb);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xc);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xd);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xe);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xf);
  uStack_d0 = auVar10._0_8_;
  uStack_c8 = auVar10._8_8_;
  auVar10 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar10 = vpinsrw_avx(auVar10,0x200,2);
  auVar10 = vpinsrw_avx(auVar10,0x200,3);
  auVar10 = vpinsrw_avx(auVar10,0x200,4);
  auVar10 = vpinsrw_avx(auVar10,0x200,5);
  auVar10 = vpinsrw_avx(auVar10,0x200,6);
  auVar10 = vpinsrw_avx(auVar10,0x200,7);
  auVar9 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar9 = vpinsrw_avx(auVar9,0x200,2);
  auVar9 = vpinsrw_avx(auVar9,0x200,3);
  auVar9 = vpinsrw_avx(auVar9,0x200,4);
  auVar9 = vpinsrw_avx(auVar9,0x200,5);
  auVar9 = vpinsrw_avx(auVar9,0x200,6);
  auVar9 = vpinsrw_avx(auVar9,0x200,7);
  auVar9 = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar9;
  auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
  uStack_90 = auVar10._0_8_;
  uStack_88 = auVar10._8_8_;
  local_4c8 = in_R8;
  local_4b8 = in_RDX;
  local_4a8 = in_RDI;
  for (local_4d4 = 0; local_4d4 < width; local_4d4 = local_4d4 + 1) {
    for (local_4d0 = 0; local_4d0 < m_stride; local_4d0 = local_4d0 + 0x20) {
      auVar1 = vlddqu_avx(*(undefined1 (*) [32])(local_4a8 + local_4d0));
      auVar2 = vlddqu_avx(*(undefined1 (*) [32])(local_4b8 + local_4d0));
      auVar3 = vlddqu_avx(*(undefined1 (*) [32])(local_4c8 + local_4d0));
      auVar4 = vlddqu_avx(*(undefined1 (*) [32])(in_stack_00000008 + local_4d0));
      auVar7._16_8_ = uStack_d0;
      auVar7._0_16_ = auVar5;
      auVar7._24_8_ = uStack_c8;
      auVar6 = vpsubb_avx2(auVar7,auVar4);
      auVar7 = vpunpcklbw_avx2(auVar2,auVar3);
      auVar8 = vpunpcklbw_avx2(auVar4,auVar6);
      auVar7 = vpmaddubsw_avx2(auVar7,auVar8);
      auVar8._16_8_ = uStack_90;
      auVar8._0_16_ = auVar9;
      auVar8._24_8_ = uStack_88;
      auVar7 = vpmulhrsw_avx2(auVar7,auVar8);
      auVar2 = vpunpckhbw_avx2(auVar2,auVar3);
      auVar3 = vpunpckhbw_avx2(auVar4,auVar6);
      auVar2 = vpmaddubsw_avx2(auVar2,auVar3);
      auVar3._16_8_ = uStack_90;
      auVar3._0_16_ = auVar9;
      auVar3._24_8_ = uStack_88;
      auVar2 = vpmulhrsw_avx2(auVar2,auVar3);
      auVar2 = vpackuswb_avx2(auVar7,auVar2);
      auVar1 = vpsadbw_avx2(auVar2,auVar1);
      local_500 = vpaddd_avx2(local_500,auVar1);
    }
    local_4a8 = local_4a8 + in_ESI;
    local_4b8 = local_4b8 + in_ECX;
    local_4c8 = local_4c8 + in_R9D;
    in_stack_00000008 = in_stack_00000008 + (int)m_ptr;
  }
  auVar1 = vpshufd_avx2(local_500,0xd8);
  auVar1 = vpermq_avx2(auVar1,0xd8);
  auVar1 = vphaddd_avx2(auVar1,auVar1);
  auVar1 = vphaddd_avx2(auVar1,auVar1);
  local_500._0_4_ = auVar1._0_4_;
  return local_500._0_4_;
}

Assistant:

static inline unsigned int masked_sad32xh_avx2(
    const uint8_t *src_ptr, int src_stride, const uint8_t *a_ptr, int a_stride,
    const uint8_t *b_ptr, int b_stride, const uint8_t *m_ptr, int m_stride,
    int width, int height) {
  int x, y;
  __m256i res = _mm256_setzero_si256();
  const __m256i mask_max = _mm256_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m256i round_scale =
      _mm256_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 32) {
      const __m256i src = _mm256_lddqu_si256((const __m256i *)&src_ptr[x]);
      const __m256i a = _mm256_lddqu_si256((const __m256i *)&a_ptr[x]);
      const __m256i b = _mm256_lddqu_si256((const __m256i *)&b_ptr[x]);
      const __m256i m = _mm256_lddqu_si256((const __m256i *)&m_ptr[x]);
      const __m256i m_inv = _mm256_sub_epi8(mask_max, m);

      // Calculate 16 predicted pixels.
      // Note that the maximum value of any entry of 'pred_l' or 'pred_r'
      // is 64 * 255, so we have plenty of space to add rounding constants.
      const __m256i data_l = _mm256_unpacklo_epi8(a, b);
      const __m256i mask_l = _mm256_unpacklo_epi8(m, m_inv);
      __m256i pred_l = _mm256_maddubs_epi16(data_l, mask_l);
      pred_l = _mm256_mulhrs_epi16(pred_l, round_scale);

      const __m256i data_r = _mm256_unpackhi_epi8(a, b);
      const __m256i mask_r = _mm256_unpackhi_epi8(m, m_inv);
      __m256i pred_r = _mm256_maddubs_epi16(data_r, mask_r);
      pred_r = _mm256_mulhrs_epi16(pred_r, round_scale);

      const __m256i pred = _mm256_packus_epi16(pred_l, pred_r);
      res = _mm256_add_epi32(res, _mm256_sad_epu8(pred, src));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have two 32-bit partial SADs in lanes 0 and 2 of 'res'.
  res = _mm256_shuffle_epi32(res, 0xd8);
  res = _mm256_permute4x64_epi64(res, 0xd8);
  res = _mm256_hadd_epi32(res, res);
  res = _mm256_hadd_epi32(res, res);
  int32_t sad = _mm256_extract_epi32(res, 0);
  return sad;
}